

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O3

bool __thiscall BinNE<0,_4,_0>::propagate(BinNE<0,_4,_0> *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  IntVar *pIVar5;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  long lVar6;
  byte bVar7;
  long lVar8;
  IntVar *pIVar9;
  
  pIVar9 = (this->x).var;
  iVar2 = (pIVar9->min).v;
  iVar4 = (pIVar9->max).v;
  if (iVar2 == iVar4) {
    pIVar5 = (this->y).var;
    iVar1 = (pIVar5->min).v;
    iVar4 = iVar2;
    if ((iVar1 == (pIVar5->max).v) && ((long)(this->y).b + (long)iVar1 == (long)iVar2)) {
      uVar3 = (this->r).v;
      bVar7 = (this->r).s;
      if ((uint)bVar7 * 2 + -1 != (int)sat.assigns.data[uVar3]) {
        if (so.lazy) {
          iVar2 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[10])();
          uVar3 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[10])();
          r._a = (ulong)uVar3 << 0x20 | (long)iVar2 << 2 | 3;
          uVar3 = (this->r).v;
          bVar7 = (this->r).s;
        }
        else {
          r._pt = (Clause *)0x0;
        }
        SAT::cEnqueue(&sat,(Lit)((uint)(bVar7 ^ 1) + uVar3 * 2),(Reason)r);
        if (sat.confl != (Clause *)0x0) {
          return false;
        }
        pIVar9 = (this->x).var;
        iVar2 = (pIVar9->min).v;
        iVar4 = (pIVar9->max).v;
        goto LAB_001b49f5;
      }
    }
  }
  else {
LAB_001b49f5:
    if (iVar2 != iVar4) goto LAB_001b4a72;
  }
  lVar8 = (long)iVar4 - (long)(this->y).b;
  pIVar5 = (this->y).var;
  if ((((pIVar5->min).v <= lVar8) && (lVar8 <= (pIVar5->max).v)) &&
     ((pIVar5->vals == (Tchar *)0x0 || (pIVar5->vals[lVar8].v != '\0')))) {
    if (so.lazy == true) {
      iVar2 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[10])();
      lVar6 = (long)iVar2 * 4 + 2;
      pIVar5 = (this->y).var;
      lVar8 = (long)iVar4 - (long)(this->y).b;
    }
    else {
      lVar6 = 0;
    }
    iVar2 = (*(pIVar5->super_Var).super_Branching._vptr_Branching[0x11])(pIVar5,lVar8,lVar6,1);
    if ((char)iVar2 == '\0') {
      return false;
    }
  }
LAB_001b4a72:
  pIVar9 = (this->y).var;
  iVar2 = (pIVar9->min).v;
  if (iVar2 != (pIVar9->max).v) {
    return true;
  }
  lVar8 = (long)(this->y).b + (long)iVar2;
  pIVar5 = (this->x).var;
  if (lVar8 < (pIVar5->min).v) {
    return true;
  }
  if ((pIVar5->max).v < lVar8) {
    return true;
  }
  if ((pIVar5->vals != (Tchar *)0x0) && (pIVar5->vals[lVar8].v == '\0')) {
    return true;
  }
  if (so.lazy == true) {
    iVar2 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[10])(pIVar9);
    lVar6 = (long)iVar2 * 4 + 2;
    pIVar5 = (this->x).var;
  }
  else {
    lVar6 = 0;
  }
  iVar2 = (*(pIVar5->super_Var).super_Branching._vptr_Branching[0x11])(pIVar5,lVar8,lVar6,1);
  if ((char)iVar2 == '\0') {
    return false;
  }
  return true;
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		if (x.isFixed() && y.isFixed() && x.getVal() == y.getVal()) {
			setDom(r, setVal, 0, x.getValLit(), y.getValLit());
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		if (x.isFixed()) {
			if (R != 0) {
				setDom(y, remVal, x.getVal(), x.getValLit(), r.getValLit());
			} else {
				setDom(y, remVal, x.getVal(), x.getValLit());
			}
		}
		if (y.isFixed()) {
			if (R != 0) {
				setDom(x, remVal, y.getVal(), y.getValLit(), r.getValLit());
			} else {
				setDom(x, remVal, y.getVal(), y.getValLit());
			}
		}

		return true;
	}